

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *r_00;
  uint64_t *puVar1;
  int *piVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_EAX;
  uint32_t uVar10;
  secp256k1_gej *psVar11;
  long lVar12;
  uint count;
  uint uVar13;
  secp256k1_gej *extraout_RDX;
  ulong uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_ge *psVar18;
  ulong uVar19;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar20;
  ulong uVar21;
  secp256k1_ge *psVar22;
  ulong uVar23;
  secp256k1_ge *r_01;
  ulong uVar24;
  secp256k1_gej *unaff_R12;
  secp256k1_fe *psVar25;
  secp256k1_gej *unaff_R13;
  uint uVar26;
  secp256k1_fe *psVar27;
  bool bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z22;
  secp256k1_fe s2;
  secp256k1_fe z12;
  undefined1 auStack_7e8 [56];
  ulong uStack_7b0;
  ulong uStack_7a8;
  ulong uStack_7a0;
  ulong uStack_798;
  ulong uStack_790;
  secp256k1_ge sStack_788;
  secp256k1_ge *psStack_720;
  undefined1 auStack_718 [56];
  uint64_t uStack_6e0;
  uint64_t uStack_6d8;
  uint64_t uStack_6d0;
  uint64_t uStack_6c8;
  int iStack_6c0;
  secp256k1_ge sStack_6a8;
  secp256k1_ge sStack_638;
  secp256k1_gej sStack_5c8;
  secp256k1_fe *psStack_530;
  secp256k1_ge *psStack_528;
  secp256k1_fe *psStack_520;
  secp256k1_ge *psStack_518;
  secp256k1_fe *psStack_510;
  secp256k1_ge *psStack_508;
  undefined1 auStack_4f8 [92];
  int iStack_49c;
  secp256k1_ge sStack_498;
  secp256k1_fe sStack_430;
  secp256k1_fe sStack_400;
  secp256k1_gej *psStack_3c8;
  secp256k1_gej *psStack_3c0;
  secp256k1_fe *psStack_3b8;
  undefined1 *puStack_3b0;
  secp256k1_fe *psStack_3a8;
  secp256k1_fe *psStack_3a0;
  secp256k1_gej sStack_398;
  int *piStack_2f8;
  secp256k1_gej *psStack_2f0;
  secp256k1_gej *psStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  undefined1 auStack_2c8 [88];
  undefined8 uStack_270;
  secp256k1_fe *local_260;
  secp256k1_fe *local_258;
  secp256k1_fe *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  uint64_t local_1f8;
  int local_1f0;
  undefined1 local_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t local_1a8;
  uint64_t uStack_1a0;
  ulong local_198;
  ulong local_190;
  undefined1 local_188 [56];
  uint64_t uStack_150;
  uint64_t local_148;
  uint64_t uStack_140;
  uint64_t local_138;
  int local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  int local_40;
  int iStack_3c;
  
  bVar29 = 0;
  uStack_270._0_4_ = 0x14d039;
  uStack_270._4_4_ = 0;
  psVar17 = a;
  secp256k1_gej_verify(a);
  uStack_270._0_4_ = 0x14d041;
  uStack_270._4_4_ = 0;
  a_01 = b;
  secp256k1_gej_verify(b);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      b = a;
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
        rzr->magnitude = 1;
        rzr->normalized = 1;
        uStack_270._0_4_ = 0x14d099;
        uStack_270._4_4_ = 0;
        secp256k1_fe_verify(rzr);
      }
      goto LAB_0014d0a4;
    }
    psVar25 = &b->z;
    uStack_270._0_4_ = 0x14d0d3;
    uStack_270._4_4_ = 0;
    local_260 = rzr;
    secp256k1_fe_sqr(&local_f8,psVar25);
    unaff_R13 = (secp256k1_gej *)&a->z;
    uStack_270._0_4_ = 0x14d0ea;
    uStack_270._4_4_ = 0;
    secp256k1_fe_sqr(&local_98,(secp256k1_fe *)unaff_R13);
    uStack_270._0_4_ = 0x14d102;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul(&local_128,&a->x,&local_f8);
    uStack_270._0_4_ = 0x14d115;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)(local_188 + 0x30),&b->x,&local_98);
    uStack_270._0_4_ = 0x14d131;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)local_188,&a->y,&local_f8);
    uStack_270._0_4_ = 0x14d144;
    uStack_270._4_4_ = 0;
    local_258 = psVar25;
    secp256k1_fe_mul((secp256k1_fe *)local_188,(secp256k1_fe *)local_188,psVar25);
    psVar25 = &b->y;
    b = (secp256k1_gej *)0x3fffffffffffc;
    uStack_270._0_4_ = 0x14d16d;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul(&local_c8,psVar25,&local_98);
    uStack_270._0_4_ = 0x14d180;
    uStack_270._4_4_ = 0;
    local_250 = (secp256k1_fe *)unaff_R13;
    secp256k1_fe_mul(&local_c8,&local_c8,(secp256k1_fe *)unaff_R13);
    uStack_270._0_4_ = 0x14d190;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&local_128);
    psVar17 = (secp256k1_gej *)0x1;
    uStack_270._0_4_ = 0x14d19d;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&local_128,1);
    local_1e8._48_8_ = 0x3ffffbfffff0bc - local_128.n[0];
    uStack_1b0 = 0x3ffffffffffffc - local_128.n[1];
    unaff_R12 = (secp256k1_gej *)(local_1e8 + 0x30);
    local_1a8 = 0x3ffffffffffffc - local_128.n[2];
    uStack_1a0 = 0x3ffffffffffffc - local_128.n[3];
    local_198 = 0x3fffffffffffc - local_128.n[4];
    local_190 = 2;
    uStack_270._0_4_ = 0x14d1ea;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    uStack_270._0_4_ = 0x14d1f2;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    rzr = (secp256k1_fe *)(local_188 + 0x30);
    uStack_270._0_4_ = 0x14d202;
    uStack_270._4_4_ = 0;
    a_01 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    if (0x20 < local_130 + (int)local_190) goto LAB_0014d842;
    local_1e8._48_8_ = local_1e8._48_8_ + local_188._48_8_;
    uStack_1b0 = uStack_1b0 + uStack_150;
    local_1a8 = local_1a8 + local_148;
    uStack_1a0 = uStack_1a0 + uStack_140;
    local_198 = local_198 + local_138;
    local_190 = (ulong)(uint)(local_130 + (int)local_190);
    uStack_270._0_4_ = 0x14d25b;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    uStack_270._0_4_ = 0x14d26b;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&local_c8);
    psVar17 = (secp256k1_gej *)0x1;
    uStack_270._0_4_ = 0x14d278;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&local_c8,1);
    local_1e8._0_8_ = 0x3ffffbfffff0bc - local_c8.n[0];
    local_1e8._8_8_ = 0x3ffffffffffffc - local_c8.n[1];
    unaff_R13 = (secp256k1_gej *)local_1e8;
    local_1e8._16_8_ = 0x3ffffffffffffc - local_c8.n[2];
    local_1e8._24_8_ = 0x3ffffffffffffc - local_c8.n[3];
    local_1e8._32_8_ = 0x3fffffffffffc - local_c8.n[4];
    local_1e8._40_8_ = 2;
    uStack_270._0_4_ = 0x14d2c5;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    uStack_270._0_4_ = 0x14d2cd;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    unaff_R12 = (secp256k1_gej *)local_188;
    uStack_270._0_4_ = 0x14d2dd;
    uStack_270._4_4_ = 0;
    a_01 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x20 < (int)(local_188._40_4_ + local_1e8._40_4_)) goto LAB_0014d847;
    local_1e8._0_8_ = local_1e8._0_8_ + local_188._0_8_;
    local_1e8._8_8_ = local_1e8._8_8_ + local_188._8_8_;
    local_1e8._16_8_ = local_1e8._16_8_ + local_188._16_8_;
    local_1e8._24_8_ = local_1e8._24_8_ + local_188._24_8_;
    local_1e8._32_8_ = local_1e8._32_8_ + local_188._32_8_;
    local_1e8._44_4_ = 0;
    local_1e8._40_4_ = local_188._40_4_ + local_1e8._40_4_;
    uStack_270._0_4_ = 0x14d34a;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)local_1e8);
    uStack_270._0_4_ = 0x14d35a;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    b = (secp256k1_gej *)0x1000003d1;
    uVar21 = (local_198 >> 0x30) * 0x1000003d1 + local_1e8._48_8_;
    if (((uVar21 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar21 & 0xfffffffffffff) == 0)) {
      uVar14 = (uVar21 >> 0x34) + uStack_1b0;
      uVar19 = (uVar14 >> 0x34) + local_1a8;
      uVar23 = (uVar19 >> 0x34) + uStack_1a0;
      uVar24 = (uVar23 >> 0x34) + (local_198 & 0xffffffffffff);
      if ((((uVar14 | uVar21 | uVar19 | uVar23) & 0xfffffffffffff) == 0 && uVar24 == 0) ||
         (((uVar21 | 0x1000003d0) & uVar14 & uVar19 & uVar23 & (uVar24 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        uStack_270._0_4_ = 0x14d73e;
        uStack_270._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)local_1e8);
        uVar21 = ((ulong)local_1e8._32_8_ >> 0x30) * 0x1000003d1 + local_1e8._0_8_;
        if (((uVar21 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar21 & 0xfffffffffffff) == 0)) {
          uVar14 = (uVar21 >> 0x34) + local_1e8._8_8_;
          uVar19 = (uVar14 >> 0x34) + local_1e8._16_8_;
          uVar23 = (uVar19 >> 0x34) + local_1e8._24_8_;
          uVar24 = (uVar23 >> 0x34) + (local_1e8._32_8_ & 0xffffffffffff);
          if ((((uVar14 | uVar21 | uVar19 | uVar23) & 0xfffffffffffff) == 0 && uVar24 == 0) ||
             (((uVar21 | 0x1000003d0) & uVar14 & uVar19 & uVar23 & (uVar24 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            uStack_270._0_4_ = 0x14d82b;
            uStack_270._4_4_ = 0;
            secp256k1_gej_double_var(r,a,local_260);
            return;
          }
        }
        if (local_260 != (secp256k1_fe *)0x0) {
          *(undefined1 (*) [16])((long)local_260->n + 0x1c) = (undefined1  [16])0x0;
          local_260->n[2] = 0;
          local_260->n[3] = 0;
          local_260->n[0] = 0;
          local_260->n[1] = 0;
          local_260->normalized = 1;
          uStack_270._0_4_ = 0x14d811;
          uStack_270._4_4_ = 0;
          secp256k1_fe_verify(local_260);
        }
        uStack_270._0_4_ = 0x14d819;
        uStack_270._4_4_ = 0;
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    uStack_270._0_4_ = 0x14d435;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)local_248,(secp256k1_fe *)(local_1e8 + 0x30),local_258);
    if (local_260 != (secp256k1_fe *)0x0) {
      local_260->n[4] = local_248._32_8_;
      local_260->magnitude = local_248._40_4_;
      local_260->normalized = local_248._44_4_;
      local_260->n[2] = local_248._16_8_;
      local_260->n[3] = local_248._24_8_;
      local_260->n[0] = local_248._0_8_;
      local_260->n[1] = local_248._8_8_;
    }
    rzr = (secp256k1_fe *)local_248;
    uStack_270._0_4_ = 0x14d473;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul(&r->z,local_250,rzr);
    a = (secp256k1_gej *)&stack0xffffffffffffff98;
    unaff_R12 = (secp256k1_gej *)(local_1e8 + 0x30);
    uStack_270._0_4_ = 0x14d48e;
    uStack_270._4_4_ = 0;
    secp256k1_fe_sqr((secp256k1_fe *)a,(secp256k1_fe *)unaff_R12);
    uStack_270._0_4_ = 0x14d496;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a);
    uStack_270._0_4_ = 0x14d4a3;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_68 = 0x3ffffbfffff0bc - local_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    local_58 = 0x3ffffffffffffc - local_58;
    uStack_50 = 0x3ffffffffffffc - uStack_50;
    local_48 = 0x3fffffffffffc - local_48;
    local_40 = 2;
    iStack_3c = 0;
    uStack_270._0_4_ = 0x14d4eb;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a);
    unaff_R13 = (secp256k1_gej *)(local_248 + 0x30);
    uStack_270._0_4_ = 0x14d4fe;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R13,(secp256k1_fe *)a,(secp256k1_fe *)unaff_R12);
    uStack_270._0_4_ = 0x14d511;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul(rzr,&local_128,(secp256k1_fe *)a);
    psVar17 = (secp256k1_gej *)local_1e8;
    uStack_270._0_4_ = 0x14d521;
    uStack_270._4_4_ = 0;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar17);
    uStack_270._0_4_ = 0x14d529;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_270._0_4_ = 0x14d531;
    uStack_270._4_4_ = 0;
    a_01 = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    iVar8 = local_1f0 + (r->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d84c;
    uVar7 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._48_8_;
    (r->x).n[1] = uVar7 + uStack_210;
    (r->x).n[2] = uVar4 + local_208;
    (r->x).n[3] = uVar5 + uStack_200;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_1f8;
    (r->x).magnitude = iVar8;
    (r->x).normalized = 0;
    uStack_270._0_4_ = 0x14d57a;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_270._0_4_ = 0x14d582;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    rzr = (secp256k1_fe *)local_248;
    uStack_270._0_4_ = 0x14d58f;
    uStack_270._4_4_ = 0;
    a_01 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar8 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d851;
    uVar7 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_248;
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar7 + local_248._8_8_;
    (r->x).n[2] = uVar4 + local_248._16_8_;
    (r->x).n[3] = uVar5 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar8;
    (r->x).normalized = 0;
    uStack_270._0_4_ = 0x14d5db;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_270._0_4_ = 0x14d5e3;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_270._0_4_ = 0x14d5eb;
    uStack_270._4_4_ = 0;
    a_01 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar8 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d856;
    uVar7 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_248;
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar7 + local_248._8_8_;
    (r->x).n[2] = uVar4 + local_248._16_8_;
    (r->x).n[3] = uVar5 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar8;
    (r->x).normalized = 0;
    uStack_270._0_4_ = 0x14d637;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_270._0_4_ = 0x14d63f;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(rzr);
    uStack_270._0_4_ = 0x14d647;
    uStack_270._4_4_ = 0;
    a_01 = r;
    secp256k1_fe_verify(&r->x);
    iVar8 = (r->x).magnitude + local_248._40_4_;
    if (0x20 < iVar8) goto LAB_0014d85b;
    local_248._0_8_ = (r->x).n[0] + local_248._0_8_;
    local_248._8_8_ = (r->x).n[1] + local_248._8_8_;
    local_248._16_8_ = (r->x).n[2] + local_248._16_8_;
    local_248._24_8_ = (r->x).n[3] + local_248._24_8_;
    local_248._32_8_ = local_248._32_8_ + (r->x).n[4];
    local_248._44_4_ = 0;
    uStack_270._0_4_ = 0x14d697;
    uStack_270._4_4_ = 0;
    local_248._40_4_ = iVar8;
    secp256k1_fe_verify((secp256k1_fe *)local_248);
    rzr = &r->y;
    uStack_270._0_4_ = 0x14d6ae;
    uStack_270._4_4_ = 0;
    secp256k1_fe_mul(rzr,(secp256k1_fe *)local_248,(secp256k1_fe *)local_1e8);
    a = (secp256k1_gej *)(local_248 + 0x30);
    uStack_270._0_4_ = 0x14d6c6;
    uStack_270._4_4_ = 0;
    psVar17 = a;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,(secp256k1_fe *)local_188);
    uStack_270._0_4_ = 0x14d6ce;
    uStack_270._4_4_ = 0;
    secp256k1_fe_verify(rzr);
    uStack_270._0_4_ = 0x14d6d6;
    uStack_270._4_4_ = 0;
    a_01 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    local_1f0 = local_1f0 + (r->y).magnitude;
    if (local_1f0 < 0x21) {
      uVar7 = (r->y).n[1];
      uVar4 = (r->y).n[2];
      uVar5 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_248._48_8_;
      (r->y).n[1] = uVar7 + uStack_210;
      (r->y).n[2] = uVar4 + local_208;
      (r->y).n[3] = uVar5 + uStack_200;
      puVar1 = (r->y).n + 4;
      *puVar1 = *puVar1 + local_1f8;
      (r->y).magnitude = local_1f0;
      (r->y).normalized = 0;
      uStack_270._0_4_ = 0x14d721;
      uStack_270._4_4_ = 0;
      secp256k1_fe_verify(rzr);
      uStack_270._0_4_ = 0x14d729;
      uStack_270._4_4_ = 0;
      secp256k1_gej_verify(r);
      return;
    }
  }
  else {
    if (rzr == (secp256k1_fe *)0x0) {
LAB_0014d0a4:
      memcpy(r,b,0x98);
      return;
    }
    uStack_270._0_4_ = 0x14d842;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_1();
LAB_0014d842:
    uStack_270._0_4_ = 0x14d847;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_8();
LAB_0014d847:
    uStack_270._0_4_ = 0x14d84c;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_7();
LAB_0014d84c:
    uStack_270._0_4_ = 0x14d851;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_6();
LAB_0014d851:
    uStack_270._0_4_ = 0x14d856;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_5();
LAB_0014d856:
    uStack_270._0_4_ = 0x14d85b;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_4();
LAB_0014d85b:
    uStack_270._0_4_ = 0x14d860;
    uStack_270._4_4_ = 0;
    secp256k1_gej_add_var_cold_3();
  }
  uStack_270 = secp256k1_ge_set_all_gej_var;
  secp256k1_gej_add_var_cold_2();
  psVar11 = psVar17;
  psVar15 = extraout_RDX;
  psStack_2d0 = extraout_RDX;
  auStack_2c8._48_8_ = r;
  auStack_2c8._56_8_ = unaff_R12;
  auStack_2c8._64_8_ = unaff_R13;
  auStack_2c8._72_8_ = rzr;
  auStack_2c8._80_8_ = a;
  uStack_270 = (code *)b;
  if (extraout_RDX == (secp256k1_gej *)0x0) {
    psVar11 = (secp256k1_gej *)0xffffffffffffffff;
  }
  else {
    do {
      psStack_2d8 = (secp256k1_gej *)0x14d897;
      secp256k1_gej_verify(psVar11);
      psVar15 = (secp256k1_gej *)&psVar15[-1].field_0x97;
      psVar11 = psVar11 + 1;
    } while (psVar15 != (secp256k1_gej *)0x0);
    psVar25 = &psVar17->z;
    psVar11 = (secp256k1_gej *)0xffffffffffffffff;
    b = (secp256k1_gej *)0x0;
    psVar15 = extraout_RDX;
    unaff_R13 = a_01;
    do {
      if ((int)psVar25[1].n[0] == 0) {
        if (psVar11 == (secp256k1_gej *)0xffffffffffffffff) {
          uVar5 = psVar25->n[0];
          uVar6 = psVar25->n[1];
          uVar7 = psVar25->n[2];
          uVar4 = psVar25->n[3];
          iVar8 = psVar25->magnitude;
          iVar3 = psVar25->normalized;
          (unaff_R13->x).n[4] = psVar25->n[4];
          (unaff_R13->x).magnitude = iVar8;
          (unaff_R13->x).normalized = iVar3;
          (unaff_R13->x).n[2] = uVar7;
          (unaff_R13->x).n[3] = uVar4;
          (unaff_R13->x).n[0] = uVar5;
          (unaff_R13->x).n[1] = uVar6;
          psVar11 = b;
        }
        else {
          psStack_2d8 = (secp256k1_gej *)0x14d8e7;
          secp256k1_fe_mul(&unaff_R13->x,(secp256k1_fe *)((long)&a_01->x + (long)psVar11 * 0x68),
                           psVar25);
          psVar11 = b;
        }
      }
      else {
        psStack_2d8 = (secp256k1_gej *)0x14d8c6;
        secp256k1_ge_set_infinity((secp256k1_ge *)unaff_R13);
        psVar15 = psStack_2d0;
      }
      b = (secp256k1_gej *)((long)(b->x).n + 1);
      unaff_R13 = (secp256k1_gej *)((unaff_R13->z).n + 1);
      psVar25 = (secp256k1_fe *)(psVar25[3].n + 1);
    } while (psVar15 != b);
  }
  if (psVar11 == (secp256k1_gej *)0xffffffffffffffff) {
    return;
  }
  psVar25 = (secp256k1_fe *)((long)psVar11 * 0x68);
  psVar15 = (secp256k1_gej *)((long)psVar25 + (long)&a_01->x);
  psVar20 = (secp256k1_gej *)auStack_2c8;
  psStack_2d8 = (secp256k1_gej *)0x14d947;
  secp256k1_fe_inv_var((secp256k1_fe *)psVar20,(secp256k1_fe *)psVar15);
  psVar16 = psStack_2d0;
  if (psVar11 != (secp256k1_gej *)0x0) {
    b = (secp256k1_gej *)&psVar11[-1].field_0x97;
    unaff_R13 = (secp256k1_gej *)&psVar17[(long)&psVar11[-1].field_0x97].infinity;
    psVar25 = (secp256k1_fe *)((long)(a_01->x).n + (long)psVar25 + -0x68);
    do {
      if ((int)(unaff_R13->x).n[0] == 0) {
        psStack_2d8 = (secp256k1_gej *)0x14d98b;
        secp256k1_fe_mul((secp256k1_fe *)((long)&a_01->x + (long)psVar11 * 0x68),psVar25,
                         (secp256k1_fe *)auStack_2c8);
        psVar16 = psStack_2d0;
        psVar15 = (secp256k1_gej *)auStack_2c8;
        psStack_2d8 = (secp256k1_gej *)0x14d9ab;
        psVar20 = psVar15;
        secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar15,&psVar17[(long)psVar11].z);
        psVar11 = b;
      }
      unaff_R13 = unaff_R13 + -1;
      psVar25 = (secp256k1_fe *)&psVar25[-3].magnitude;
      bVar28 = b != (secp256k1_gej *)0x0;
      b = (secp256k1_gej *)&b[-1].field_0x97;
    } while (bVar28);
  }
  if (psVar17[(long)psVar11].infinity == 0) {
    lVar12 = (long)psVar11 * 0x68;
    puVar1 = (uint64_t *)((long)&a_01->y + lVar12 + -0x10);
    *puVar1 = auStack_2c8._32_8_;
    puVar1[1] = auStack_2c8._40_8_;
    puVar1 = (uint64_t *)((long)&a_01->x + lVar12 + 0x10);
    *puVar1 = auStack_2c8._16_8_;
    puVar1[1] = auStack_2c8._24_8_;
    puVar1 = (uint64_t *)((long)&a_01->x + lVar12);
    *puVar1 = auStack_2c8._0_8_;
    puVar1[1] = auStack_2c8._8_8_;
    psVar11 = a_01;
    psVar15 = psVar16;
    if (psVar16 == (secp256k1_gej *)0x0) {
      return;
    }
    do {
      if (psVar17->infinity == 0) {
        psStack_2d8 = (secp256k1_gej *)0x14da1e;
        secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar11,psVar17,&psVar11->x);
      }
      psVar17 = psVar17 + 1;
      psVar20 = psVar15 + -1;
      psVar11 = (secp256k1_gej *)((psVar11->z).n + 1);
      psVar15 = (secp256k1_gej *)&psVar20->field_0x97;
    } while (&psVar20->field_0x97 != (undefined1 *)0x0);
    do {
      psStack_2d8 = (secp256k1_gej *)0x14da36;
      secp256k1_ge_verify((secp256k1_ge *)a_01);
      a_01 = (secp256k1_gej *)((a_01->z).n + 1);
      psVar16 = (secp256k1_gej *)&psVar16[-1].field_0x97;
    } while (psVar16 != (secp256k1_gej *)0x0);
    return;
  }
  psStack_2d8 = (secp256k1_gej *)test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  psVar11 = &sStack_398;
  psVar16 = &sStack_398;
  psStack_3a0 = (secp256k1_fe *)0x14da7d;
  piStack_2f8 = (int *)psVar25;
  psStack_2f0 = unaff_R13;
  psStack_2e8 = a_01;
  psStack_2e0 = psVar17;
  psStack_2d8 = b;
  memcpy(&sStack_398,psVar20,0x98);
  psStack_3a0 = (secp256k1_fe *)0x14da85;
  secp256k1_gej_verify(&sStack_398);
  psStack_3a0 = (secp256k1_fe *)0x14da8d;
  secp256k1_gej_verify(psVar15);
  psStack_3a0 = (secp256k1_fe *)0x14da9a;
  secp256k1_fe_cmov(&sStack_398.x,&psVar15->x,0);
  psVar25 = &psVar15->y;
  psStack_3a0 = (secp256k1_fe *)0x14daad;
  secp256k1_fe_cmov(&sStack_398.y,psVar25,0);
  r_00 = &sStack_398.z;
  psVar27 = &psVar15->z;
  psStack_3a0 = (secp256k1_fe *)0x14dac3;
  secp256k1_fe_cmov(r_00,psVar27,0);
  psStack_3a0 = (secp256k1_fe *)0x14dacb;
  secp256k1_gej_verify(&sStack_398);
  psStack_3a0 = (secp256k1_fe *)0x14dad6;
  psVar17 = psVar20;
  iVar8 = gej_xyz_equals_gej(&sStack_398,psVar20);
  if (iVar8 == 0) {
    psStack_3a0 = (secp256k1_fe *)0x14db6d;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_3a0 = (secp256k1_fe *)0x14dae9;
    secp256k1_gej_verify(&sStack_398);
    psStack_3a0 = (secp256k1_fe *)0x14daf1;
    secp256k1_gej_verify(psVar15);
    psStack_3a0 = (secp256k1_fe *)0x14db01;
    secp256k1_fe_cmov(&sStack_398.x,&psVar15->x,1);
    psStack_3a0 = (secp256k1_fe *)0x14db13;
    secp256k1_fe_cmov(&sStack_398.y,psVar25,1);
    psStack_3a0 = (secp256k1_fe *)0x14db23;
    secp256k1_fe_cmov(r_00,psVar27,1);
    sStack_398.infinity = sStack_398.infinity & 0xfffffffeU | psVar15->infinity & 1U;
    psStack_3a0 = (secp256k1_fe *)0x14db47;
    secp256k1_gej_verify(&sStack_398);
    psStack_3a0 = (secp256k1_fe *)0x14db52;
    psVar17 = psVar15;
    iVar8 = gej_xyz_equals_gej(&sStack_398,psVar15);
    psVar11 = psVar16;
    if (iVar8 != 0) {
      return;
    }
  }
  psStack_3a0 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_3a0 = psVar27;
  psStack_3a8 = psVar25;
  puStack_3b0 = (undefined1 *)&sStack_398;
  psStack_3b8 = r_00;
  psStack_3c0 = psVar20;
  psStack_3c8 = psVar15;
  if ((*(int *)((long)psVar11 + 0x90) != psVar17->infinity) || (*(int *)((long)psVar11 + 0x90) != 0)
     ) {
    return;
  }
  psVar25 = (secp256k1_fe *)(sStack_498.y.n + 1);
  psStack_508 = (secp256k1_ge *)0x14dbbf;
  memcpy(psVar25,psVar11,0x98);
  psVar18 = (secp256k1_ge *)auStack_4f8;
  psStack_508 = (secp256k1_ge *)0x14dbd4;
  memcpy(psVar18,psVar17,0x98);
  psStack_508 = (secp256k1_ge *)0x14dbdc;
  secp256k1_fe_normalize(psVar25);
  psVar27 = &sStack_430;
  psStack_508 = (secp256k1_ge *)0x14dbec;
  secp256k1_fe_normalize(psVar27);
  psStack_508 = (secp256k1_ge *)0x14dbfc;
  secp256k1_fe_normalize(&sStack_400);
  psStack_508 = (secp256k1_ge *)0x14dc04;
  secp256k1_fe_normalize((secp256k1_fe *)psVar18);
  psVar22 = (secp256k1_ge *)(auStack_4f8 + 0x30);
  psStack_508 = (secp256k1_ge *)0x14dc11;
  secp256k1_fe_normalize((secp256k1_fe *)psVar22);
  psStack_508 = (secp256k1_ge *)0x14dc1e;
  secp256k1_fe_normalize(&sStack_498.x);
  psStack_508 = (secp256k1_ge *)0x14dc26;
  secp256k1_fe_verify(psVar25);
  psStack_508 = (secp256k1_ge *)0x14dc2e;
  a_00 = psVar18;
  secp256k1_fe_verify((secp256k1_fe *)psVar18);
  if (sStack_498._100_4_ == 0) {
    psStack_508 = (secp256k1_ge *)0x14dd33;
    gej_xyz_equals_gej_cold_6();
LAB_0014dd33:
    psStack_508 = (secp256k1_ge *)0x14dd38;
    gej_xyz_equals_gej_cold_5();
LAB_0014dd38:
    psStack_508 = (secp256k1_ge *)0x14dd3d;
    gej_xyz_equals_gej_cold_4();
LAB_0014dd3d:
    psStack_508 = (secp256k1_ge *)0x14dd42;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (auStack_4f8._44_4_ == 0) goto LAB_0014dd33;
    uVar9 = 4;
    do {
      uVar21 = *(ulong *)(auStack_4f8 + (ulong)uVar9 * 8);
      uVar14 = sStack_498.y.n[(ulong)uVar9 + 1];
      if (uVar14 >= uVar21 && uVar14 != uVar21) {
        psVar18 = (secp256k1_ge *)0x1;
        goto LAB_0014dc70;
      }
      if (uVar14 < uVar21) {
        psVar18 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014dc70;
      }
      bVar28 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar28);
    psVar18 = (secp256k1_ge *)0x0;
LAB_0014dc70:
    psStack_508 = (secp256k1_ge *)0x14dc78;
    secp256k1_fe_verify(psVar27);
    psStack_508 = (secp256k1_ge *)0x14dc80;
    a_00 = psVar22;
    secp256k1_fe_verify((secp256k1_fe *)psVar22);
    if (sStack_430.normalized == 0) goto LAB_0014dd38;
    if (iStack_49c == 0) goto LAB_0014dd3d;
    uVar9 = 4;
    do {
      uVar21 = *(ulong *)(auStack_4f8 + (ulong)uVar9 * 8 + 0x30);
      uVar14 = sStack_430.n[uVar9];
      if (uVar14 >= uVar21 && uVar14 != uVar21) {
        psVar27 = (secp256k1_fe *)0x1;
        goto LAB_0014dcc9;
      }
      if (uVar14 < uVar21) {
        psVar27 = (secp256k1_fe *)0xffffffff;
        goto LAB_0014dcc9;
      }
      bVar28 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar28);
    psVar27 = (secp256k1_fe *)0x0;
LAB_0014dcc9:
    psStack_508 = (secp256k1_ge *)0x14dcd1;
    secp256k1_fe_verify(&sStack_400);
    psStack_508 = (secp256k1_ge *)0x14dcd9;
    a_00 = &sStack_498;
    secp256k1_fe_verify(&sStack_498.x);
    if (sStack_400.normalized != 0) {
      if (sStack_498.x.normalized != 0) {
        uVar9 = 4;
        do {
          if (sStack_400.n[uVar9] != sStack_498.x.n[uVar9]) {
            return;
          }
          bVar28 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar28);
        return;
      }
      goto LAB_0014dd47;
    }
  }
  psStack_508 = (secp256k1_ge *)0x14dd47;
  gej_xyz_equals_gej_cold_2();
LAB_0014dd47:
  psStack_508 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_6a8;
  psStack_720 = a_00;
  psStack_530 = &sStack_400;
  psStack_528 = psVar22;
  psStack_520 = psVar25;
  psStack_518 = &sStack_498;
  psStack_510 = psVar27;
  psStack_508 = psVar18;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)a_00);
  iVar8 = secp256k1_ge_is_valid_var(r_01);
  if (iVar8 != 0) {
    secp256k1_gej_set_ge(&sStack_5c8,&sStack_6a8);
    secp256k1_gej_double_var(&sStack_5c8,&sStack_5c8,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_718,&sStack_5c8);
    sStack_788._96_8_ = 0x40;
    while( true ) {
      psVar22 = (secp256k1_ge *)(auStack_718 + 0x30);
      secp256k1_fe_verify(&sStack_6a8.x);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_6a8.x,1);
      auStack_7e8._0_8_ = 0x3ffffbfffff0bc - sStack_6a8.x.n[0];
      auStack_7e8._8_8_ = 0x3ffffffffffffc - sStack_6a8.x.n[1];
      auStack_7e8._16_8_ = 0x3ffffffffffffc - sStack_6a8.x.n[2];
      auStack_7e8._24_8_ = 0x3ffffffffffffc - sStack_6a8.x.n[3];
      auStack_7e8._32_8_ = 0x3fffffffffffc - sStack_6a8.x.n[4];
      auStack_7e8._40_4_ = 2;
      auStack_7e8._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      r_01 = (secp256k1_ge *)auStack_718;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < (int)(auStack_718._40_4_ + auStack_7e8._40_4_)) break;
      auStack_7e8._0_8_ = auStack_7e8._0_8_ + auStack_718._0_8_;
      auStack_7e8._8_8_ = auStack_7e8._8_8_ + auStack_718._8_8_;
      auStack_7e8._16_8_ = auStack_7e8._16_8_ + auStack_718._16_8_;
      auStack_7e8._24_8_ = auStack_7e8._24_8_ + auStack_718._24_8_;
      auStack_7e8._32_8_ = auStack_7e8._32_8_ + auStack_718._32_8_;
      auStack_7e8._44_4_ = 0;
      auStack_7e8._40_4_ = auStack_718._40_4_ + auStack_7e8._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      auStack_7e8._0_8_ = ((ulong)auStack_7e8._32_8_ >> 0x30) * 0x1000003d1 + auStack_7e8._0_8_;
      auStack_7e8._8_8_ = ((ulong)auStack_7e8._0_8_ >> 0x34) + auStack_7e8._8_8_;
      auStack_7e8._16_8_ = ((ulong)auStack_7e8._8_8_ >> 0x34) + auStack_7e8._16_8_;
      uVar21 = ((ulong)auStack_7e8._16_8_ >> 0x34) + auStack_7e8._24_8_;
      auStack_7e8._24_8_ = uVar21 & 0xfffffffffffff;
      auStack_7e8._32_8_ = (uVar21 >> 0x34) + (auStack_7e8._32_8_ & 0xffffffffffff);
      auStack_7e8._16_8_ = auStack_7e8._16_8_ & 0xfffffffffffff;
      auStack_7e8._8_8_ = auStack_7e8._8_8_ & 0xfffffffffffff;
      auStack_7e8._0_8_ = auStack_7e8._0_8_ & 0xfffffffffffff;
      auStack_7e8._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      secp256k1_fe_verify(&sStack_6a8.y);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_6a8.y,1);
      auStack_7e8._48_8_ = 0x3ffffbfffff0bc - sStack_6a8.y.n[0];
      uStack_7b0 = 0x3ffffffffffffc - sStack_6a8.y.n[1];
      uStack_7a8 = 0x3ffffffffffffc - sStack_6a8.y.n[2];
      uStack_7a0 = 0x3ffffffffffffc - sStack_6a8.y.n[3];
      uStack_798 = 0x3fffffffffffc - sStack_6a8.y.n[4];
      uStack_790._0_4_ = 2;
      uStack_790._4_4_ = 0;
      psVar25 = (secp256k1_fe *)(auStack_7e8 + 0x30);
      secp256k1_fe_verify(psVar25);
      secp256k1_fe_verify(psVar25);
      secp256k1_fe_verify((secp256k1_fe *)psVar22);
      r_01 = psVar22;
      if (0x20 < iStack_6c0 + (int)uStack_790) goto LAB_0014e60e;
      auStack_7e8._48_8_ = auStack_7e8._48_8_ + auStack_718._48_8_;
      uStack_7b0 = uStack_7b0 + uStack_6e0;
      uStack_7a8 = uStack_7a8 + uStack_6d8;
      uStack_7a0 = uStack_7a0 + uStack_6d0;
      uStack_798 = uStack_798 + uStack_6c8;
      uStack_790 = (ulong)(uint)(iStack_6c0 + (int)uStack_790);
      secp256k1_fe_verify(psVar25);
      secp256k1_fe_verify(psVar25);
      auStack_7e8._48_8_ = (uStack_798 >> 0x30) * 0x1000003d1 + auStack_7e8._48_8_;
      uStack_7b0 = ((ulong)auStack_7e8._48_8_ >> 0x34) + uStack_7b0;
      uStack_7a8 = (uStack_7b0 >> 0x34) + uStack_7a8;
      uVar21 = (uStack_7a8 >> 0x34) + uStack_7a0;
      uStack_7a0 = uVar21 & 0xfffffffffffff;
      uStack_798 = (uVar21 >> 0x34) + (uStack_798 & 0xffffffffffff);
      uStack_7a8 = uStack_7a8 & 0xfffffffffffff;
      uStack_7b0 = uStack_7b0 & 0xfffffffffffff;
      auStack_7e8._48_8_ = auStack_7e8._48_8_ & 0xfffffffffffff;
      uStack_790 = CONCAT44(uStack_790._4_4_,1);
      secp256k1_fe_verify(psVar25);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
      uVar21 = ((ulong)auStack_7e8._32_8_ >> 0x30) * 0x1000003d1 + auStack_7e8._0_8_;
      if (((uVar21 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar21 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar21 >> 0x34) + auStack_7e8._8_8_;
        uVar19 = (uVar14 >> 0x34) + auStack_7e8._16_8_;
        uVar23 = (uVar19 >> 0x34) + auStack_7e8._24_8_;
        uVar24 = (uVar23 >> 0x34) + (auStack_7e8._32_8_ & 0xffffffffffff);
        if ((((uVar14 | uVar21 | uVar19 | uVar23) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar21 + 0x1000003d0 & uVar14 & uVar19 & uVar23 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e212;
        secp256k1_fe_verify(psVar25);
        uVar21 = (uStack_798 >> 0x30) * 0x1000003d1 + auStack_7e8._48_8_;
        if (((uVar21 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar21 & 0xfffffffffffff) != 0))
        goto LAB_0014e212;
        uVar14 = (uVar21 >> 0x34) + uStack_7b0;
        a_00 = (secp256k1_ge *)((uVar14 >> 0x34) + uStack_7a8);
        r_01 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + uStack_7a0);
        uVar19 = ((ulong)r_01 >> 0x34) + (uStack_798 & 0xffffffffffff);
        if ((((uVar14 | uVar21 | (ulong)a_00 | (ulong)r_01) & 0xfffffffffffff) != 0 || uVar19 != 0)
           && ((uVar21 + 0x1000003d0 & uVar14 & (ulong)a_00 & (ulong)r_01 &
               (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e212;
        goto LAB_0014e62c;
      }
LAB_0014e212:
      psVar18 = (secp256k1_ge *)((long)(psStack_720->x).n + sStack_788._96_8_);
      secp256k1_ge_from_storage(&sStack_638,(secp256k1_ge_storage *)psVar18);
      r_01 = &sStack_638;
      iVar8 = secp256k1_ge_is_valid_var(&sStack_638);
      if (iVar8 == 0) goto LAB_0014e613;
      secp256k1_fe_verify(&sStack_638.x);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_638.x,1);
      sStack_788.y.n[0] = 0x3ffffbfffff0bc - sStack_638.x.n[0];
      sStack_788.y.n[1] = 0x3ffffffffffffc - sStack_638.x.n[1];
      sStack_788.y.n[2] = 0x3ffffffffffffc - sStack_638.x.n[2];
      sStack_788.y.n[3] = 0x3ffffffffffffc - sStack_638.x.n[3];
      sStack_788.y.n[4] = 0x3fffffffffffc - sStack_638.x.n[4];
      sStack_788.y.magnitude = 2;
      sStack_788.y.normalized = 0;
      psVar25 = &sStack_788.y;
      secp256k1_fe_verify(psVar25);
      secp256k1_fe_verify(psVar25);
      r_01 = (secp256k1_ge *)auStack_718;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < auStack_718._40_4_ + sStack_788.y.magnitude) goto LAB_0014e618;
      sStack_788.y.n[0] = sStack_788.y.n[0] + auStack_718._0_8_;
      sStack_788.y.n[1] = sStack_788.y.n[1] + auStack_718._8_8_;
      sStack_788.y.n[2] = sStack_788.y.n[2] + auStack_718._16_8_;
      sStack_788.y.n[3] = sStack_788.y.n[3] + auStack_718._24_8_;
      sStack_788.y.n[4] = sStack_788.y.n[4] + auStack_718._32_8_;
      sStack_788.y.normalized = 0;
      sStack_788.y.magnitude = auStack_718._40_4_ + sStack_788.y.magnitude;
      secp256k1_fe_verify(psVar25);
      sStack_788.x.n[4] = sStack_638.y.n[4];
      sStack_788.x.magnitude = sStack_638.y.magnitude;
      sStack_788.x.normalized = sStack_638.y.normalized;
      sStack_788.x.n[2] = sStack_638.y.n[2];
      sStack_788.x.n[3] = sStack_638.y.n[3];
      sStack_788.x.n[0] = sStack_638.y.n[0];
      sStack_788.x.n[1] = sStack_638.y.n[1];
      secp256k1_fe_verify(&sStack_788.x);
      r_01 = (secp256k1_ge *)(auStack_718 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < iStack_6c0 + sStack_788.x.magnitude) goto LAB_0014e61d;
      sStack_788.x.n[0] = sStack_788.x.n[0] + auStack_718._48_8_;
      sStack_788.x.n[1] = sStack_788.x.n[1] + uStack_6e0;
      sStack_788.x.n[2] = sStack_788.x.n[2] + uStack_6d8;
      sStack_788.x.n[3] = sStack_788.x.n[3] + uStack_6d0;
      sStack_788.x.n[4] = sStack_788.x.n[4] + uStack_6c8;
      sStack_788.x.normalized = 0;
      sStack_788.x.magnitude = iStack_6c0 + sStack_788.x.magnitude;
      secp256k1_fe_verify(&sStack_788.x);
      secp256k1_fe_verify(psVar25);
      uVar21 = (sStack_788.y.n[4] >> 0x30) * 0x1000003d1 + sStack_788.y.n[0];
      if (((uVar21 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar21 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar21 >> 0x34) + sStack_788.y.n[1];
        uVar19 = (uVar14 >> 0x34) + sStack_788.y.n[2];
        uVar23 = (uVar19 >> 0x34) + sStack_788.y.n[3];
        uVar24 = (uVar23 >> 0x34) + (sStack_788.y.n[4] & 0xffffffffffff);
        if ((((uVar14 | uVar21 | uVar19 | uVar23) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar21 + 0x1000003d0 & uVar14 & uVar19 & uVar23 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e55f;
        secp256k1_fe_verify(&sStack_788.x);
        uVar21 = (sStack_788.x.n[4] >> 0x30) * 0x1000003d1 + sStack_788.x.n[0];
        if (((uVar21 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar21 & 0xfffffffffffff) != 0))
        goto LAB_0014e55f;
        uVar14 = (uVar21 >> 0x34) + sStack_788.x.n[1];
        a_00 = (secp256k1_ge *)((uVar14 >> 0x34) + sStack_788.x.n[2]);
        r_01 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + sStack_788.x.n[3]);
        uVar19 = ((ulong)r_01 >> 0x34) + (sStack_788.x.n[4] & 0xffffffffffff);
        if ((((uVar14 | uVar21 | (ulong)a_00 | (ulong)r_01) & 0xfffffffffffff) != 0 || uVar19 != 0)
           && ((uVar21 + 0x1000003d0 & uVar14 & (ulong)a_00 & (ulong)r_01 &
               (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e55f;
        goto LAB_0014e631;
      }
LAB_0014e55f:
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_7e8,psVar25);
      psVar18 = (secp256k1_ge *)(auStack_7e8 + 0x30);
      if ((iVar8 != 0) &&
         (a_00 = &sStack_788, r_01 = psVar18,
         iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar18,&sStack_788.x), iVar8 != 0))
      goto LAB_0014e627;
      secp256k1_fe_mul((secp256k1_fe *)auStack_7e8,(secp256k1_fe *)auStack_7e8,&sStack_788.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar18,(secp256k1_fe *)psVar18,&sStack_788.y);
      r_01 = (secp256k1_ge *)auStack_7e8;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_7e8,(secp256k1_fe *)psVar18);
      if (iVar8 == 0) goto LAB_0014e622;
      psVar18 = &sStack_638;
      psVar22 = &sStack_6a8;
      for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
        (psVar22->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar29 * -2 + 1) * 8);
        psVar22 = (secp256k1_ge *)((long)psVar22 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      sStack_788._96_8_ = sStack_788._96_8_ + 0x40;
      if (sStack_788._96_8_ == 0x80000) {
        return;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014e60e:
    test_pre_g_table_cold_8();
LAB_0014e613:
    test_pre_g_table_cold_7();
LAB_0014e618:
    test_pre_g_table_cold_6();
LAB_0014e61d:
    test_pre_g_table_cold_5();
LAB_0014e622:
    test_pre_g_table_cold_4();
    a_00 = psVar18;
LAB_0014e627:
    test_pre_g_table_cold_3();
LAB_0014e62c:
    test_pre_g_table_cold_1();
LAB_0014e631:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)a_00);
  auVar30._0_4_ = -(uint)((int)(a_00->x).n[2] == 0 && (int)(a_00->x).n[0] == 0);
  auVar30._4_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x14) == 0 && *(int *)((long)(a_00->x).n + 4) == 0);
  auVar30._8_4_ = -(uint)((int)(a_00->x).n[3] == 0 && (int)(a_00->x).n[1] == 0);
  auVar30._12_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x1c) == 0 && *(int *)((long)(a_00->x).n + 0xc) == 0);
  iVar8 = movmskps(extraout_EAX,auVar30);
  if (iVar8 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)count)) {
      memset(r_01,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)a_00);
    uVar7 = (a_00->x).n[0];
    uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,0,count);
    *(uint32_t *)(r_01->x).n = uVar10 + (~(uint)uVar7 & 1);
    iVar8 = (int)(0x7f / (long)(int)count);
    uVar9 = iVar8 * count;
    uVar26 = 0x80 - uVar9;
    uVar21 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar8) {
      lVar12 = 0;
      uVar14 = uVar21;
      do {
        uVar13 = count;
        if (lVar12 == 0) {
          uVar13 = uVar26;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar9,uVar13);
        if (uVar10 != 0) goto LAB_0014e710;
        *(undefined4 *)((long)(r_01->x).n + uVar14 * 4) = 0;
        uVar9 = uVar9 - count;
        lVar12 = lVar12 + 1;
        bVar28 = 1 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar28);
      uVar14 = 0;
LAB_0014e710:
      iVar8 = (int)uVar14;
    }
    if (0 < iVar8) {
      uVar14 = 1;
      uVar9 = count;
      do {
        uVar13 = count;
        if (uVar21 == uVar14) {
          uVar13 = uVar26;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar9,uVar13);
        if ((uVar10 & 1) == 0) {
          piVar2 = (int *)((long)(r_01->x).n + uVar14 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar10 = uVar10 | 1;
        }
        *(uint32_t *)((long)(r_01->x).n + uVar14 * 4) = uVar10;
        if ((1 < uVar14) &&
           (((iVar3 = *(int *)((long)(r_01->x).n + uVar14 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(r_01->x).n + uVar14 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(r_01->x).n + uVar14 * 4 + -8))))))) {
          piVar2 = (int *)((long)(r_01->x).n + uVar14 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(r_01->x).n + uVar14 * 4 + -4) = 0;
        }
        uVar14 = uVar14 + 1;
        uVar9 = uVar9 + count;
      } while (iVar8 + 1 != uVar14);
    }
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}